

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_7zip.c
# Opt level: O2

int write_to_temp(archive_write *a,void *buff,size_t s)

{
  long *plVar1;
  ssize_t sVar2;
  int *piVar3;
  
  piVar3 = (int *)a->format_data;
  while( true ) {
    if (s == 0) {
      return 0;
    }
    sVar2 = write(*piVar3,buff,s);
    if (sVar2 < 0) break;
    s = s - sVar2;
    buff = (void *)((long)buff + sVar2);
    plVar1 = (long *)(piVar3 + 2);
    *plVar1 = *plVar1 + sVar2;
  }
  piVar3 = __errno_location();
  archive_set_error(&a->archive,*piVar3,"fwrite function failed");
  return -0x1e;
}

Assistant:

static int
write_to_temp(struct archive_write *a, const void *buff, size_t s)
{
	struct _7zip *zip;
	const unsigned char *p;
	ssize_t ws;

	zip = (struct _7zip *)a->format_data;

	/*
	 * Open a temporary file.
	 */
	if (zip->temp_fd == -1) {
		zip->temp_offset = 0;
		zip->temp_fd = __archive_mktemp(NULL);
		if (zip->temp_fd < 0) {
			archive_set_error(&a->archive, errno,
			    "Couldn't create temporary file");
			return (ARCHIVE_FATAL);
		}
	}

	p = (const unsigned char *)buff;
	while (s) {
		ws = write(zip->temp_fd, p, s);
		if (ws < 0) {
			archive_set_error(&(a->archive), errno,
			    "fwrite function failed");
			return (ARCHIVE_FATAL);
		}
		s -= ws;
		p += ws;
		zip->temp_offset += ws;
	}
	return (ARCHIVE_OK);
}